

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::autoCompleteFileName(QFileDialogPrivate *this,QString *text)

{
  char cVar1;
  bool bVar2;
  difference_type dVar3;
  QItemSelectionModel *pQVar4;
  fd_set *__writefds;
  fd_set *in_R8;
  timeval *in_R9;
  QString *file;
  QModelIndex *newFile;
  QModelIndex *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 local_b8 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  QArrayDataPointer<QModelIndex> local_98;
  QArrayDataPointer<QModelIndex> local_78;
  QArrayDataPointer<QString> local_58;
  QWidget *local_38;
  
  local_38 = *(QWidget **)(in_FS_OFFSET + 0x28);
  __writefds = (fd_set *)0x1;
  cVar1 = QString::startsWith((QLatin1String *)text,2);
  if (cVar1 == '\0') {
    cVar1 = QString::startsWith((QChar)(char16_t)text,0x5c);
    if (cVar1 == '\0') {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      typedFiles((QStringList *)&local_58,this);
      if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
        local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
        QItemSelectionModel::selectedRows((int)&local_78);
        local_98.d = (Data *)0x0;
        local_98.ptr = (QModelIndex *)0x0;
        local_98.size = 0;
        for (lVar6 = local_58.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
          local_a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          __writefds = (fd_set *)0x0;
          QFileSystemModel::index((QString *)local_b8,(int)this->model);
          dVar3 = QtPrivate::sequential_erase_with_copy<QList<QModelIndex>,QModelIndex>
                            ((QList<QModelIndex> *)&local_78,(QModelIndex *)local_b8);
          if (dVar3 == 0) {
            QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                      ((QList<QModelIndex> *)&local_98,(QModelIndex *)local_b8);
          }
        }
        pQVar5 = local_98.ptr;
        for (lVar6 = local_98.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
          select((QFileDialogPrivate *)local_b8,(int)this,(fd_set *)pQVar5,__writefds,in_R8,in_R9);
          pQVar5 = pQVar5 + 1;
        }
        bVar2 = QWidget::hasFocus((QWidget *)((this->qFileDialogUi).d)->fileNameEdit);
        if (bVar2) {
          pQVar4 = QAbstractItemView::selectionModel
                             ((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
          pQVar5 = local_78.ptr;
          for (lVar6 = local_78.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
            (**(code **)(*(long *)pQVar4 + 0x68))(pQVar4,pQVar5,0x28);
            pQVar5 = pQVar5 + 1;
          }
        }
        QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_78);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      if (*(QWidget **)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_004a00e0;
    }
  }
  QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
  if (*(QWidget **)(in_FS_OFFSET + 0x28) == local_38) {
    QItemSelectionModel::clearSelection();
    return;
  }
LAB_004a00e0:
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::autoCompleteFileName(const QString &text)
{
    if (text.startsWith("//"_L1) || text.startsWith(u'\\')) {
        qFileDialogUi->listView->selectionModel()->clearSelection();
        return;
    }

    const QStringList multipleFiles = typedFiles();
    if (multipleFiles.size() > 0) {
        QModelIndexList oldFiles = qFileDialogUi->listView->selectionModel()->selectedRows();
        QList<QModelIndex> newFiles;
        for (const auto &file : multipleFiles) {
            QModelIndex idx = model->index(file);
            if (oldFiles.removeAll(idx) == 0)
                newFiles.append(idx);
        }
        for (const auto &newFile : std::as_const(newFiles))
            select(newFile);
        if (lineEdit()->hasFocus()) {
            auto *sm = qFileDialogUi->listView->selectionModel();
            for (const auto &oldFile : std::as_const(oldFiles))
                sm->select(oldFile, QItemSelectionModel::Toggle | QItemSelectionModel::Rows);
        }
    }
}